

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.h
# Opt level: O0

void __thiscall StreamCursor::Revert::Revert(Revert *this,StreamCursor *cursor)

{
  char *pcVar1;
  StreamCursor *cursor_local;
  Revert *this_local;
  
  this->cursor = cursor;
  pcVar1 = StreamBuf<char>::begptr(cursor->buf);
  this->eback = pcVar1;
  pcVar1 = StreamBuf<char>::curptr(cursor->buf);
  this->gptr = pcVar1;
  pcVar1 = StreamBuf<char>::endptr(cursor->buf);
  this->egptr = pcVar1;
  this->active = true;
  return;
}

Assistant:

Revert(StreamCursor& cursor)
            : cursor(cursor)
            , eback(cursor.buf->begptr())
            , gptr(cursor.buf->curptr())
            , egptr(cursor.buf->endptr())
            , active(true)
        { }